

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall double_conversion::Bignum::ShiftLeft(Bignum *this,int shift_amount)

{
  if (this->used_bigits_ == 0) {
    return;
  }
  this->exponent_ = this->exponent_ + (short)(shift_amount / 0x1c);
  if (this->used_bigits_ < 0x80) {
    BigitsShiftLeft(this,shift_amount % 0x1c);
    return;
  }
  abort();
}

Assistant:

void Bignum::ShiftLeft(const int shift_amount) {
  if (used_bigits_ == 0) {
    return;
  }
  exponent_ += static_cast<int16_t>(shift_amount / kBigitSize);
  const int local_shift = shift_amount % kBigitSize;
  EnsureCapacity(used_bigits_ + 1);
  BigitsShiftLeft(local_shift);
}